

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::JsonStreamParser::JsonStreamParser
          (JsonStreamParser *this,ObjectWriter *ow)

{
  _Elt_pointer pPVar1;
  ParseType local_34;
  
  this->_vptr_JsonStreamParser = (_func_int **)&PTR__JsonStreamParser_003c8e58;
  this->ow_ = ow;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ::_M_initialize_map((_Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                       *)&this->stack_,0);
  (this->leftover_)._M_dataplus._M_p = (pointer)&(this->leftover_).field_2;
  (this->leftover_)._M_string_length = 0;
  (this->leftover_).field_2._M_local_buf[0] = '\0';
  (this->json_).ptr_ = (char *)0x0;
  (this->json_).length_ = 0;
  (this->p_).ptr_ = (char *)0x0;
  (this->p_).length_ = 0;
  (this->key_).ptr_ = (char *)0x0;
  (this->key_).length_ = 0;
  (this->key_storage_)._M_dataplus._M_p = (pointer)&(this->key_storage_).field_2;
  (this->key_storage_)._M_string_length = 0;
  (this->key_storage_).field_2._M_local_buf[0] = '\0';
  this->finishing_ = false;
  (this->parsed_).ptr_ = (char *)0x0;
  (this->parsed_).length_ = 0;
  (this->parsed_storage_)._M_dataplus._M_p = (pointer)&(this->parsed_storage_).field_2;
  (this->parsed_storage_)._M_string_length = 0;
  (this->parsed_storage_).field_2._M_local_buf[0] = '\0';
  this->string_open_ = '\0';
  (this->chunk_storage_)._M_dataplus._M_p = (pointer)&(this->chunk_storage_).field_2;
  (this->chunk_storage_)._M_string_length = 0;
  (this->chunk_storage_).field_2._M_local_buf[0] = '\0';
  this->coerce_to_utf8_ = false;
  (this->utf8_replacement_character_)._M_dataplus._M_p =
       (pointer)&(this->utf8_replacement_character_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->utf8_replacement_character_," ","");
  this->allow_empty_null_ = false;
  this->allow_permissive_key_naming_ = false;
  this->loose_float_number_conversion_ = false;
  this->recursion_depth_ = 0;
  this->max_recursion_depth_ = 100;
  local_34 = VALUE;
  pPVar1 = (this->stack_).c.
           super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pPVar1 == (this->stack_).c.
                super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,&local_34);
  }
  else {
    *pPVar1 = VALUE;
    (this->stack_).c.
    super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar1 + 1;
  }
  return;
}

Assistant:

JsonStreamParser::JsonStreamParser(ObjectWriter* ow)
    : ow_(ow),
      stack_(),
      leftover_(),
      json_(),
      p_(),
      key_(),
      key_storage_(),
      finishing_(false),
      parsed_(),
      parsed_storage_(),
      string_open_(0),
      chunk_storage_(),
      coerce_to_utf8_(false),
      utf8_replacement_character_(" "),
      allow_empty_null_(false),
      allow_permissive_key_naming_(false),
      loose_float_number_conversion_(false),
      recursion_depth_(0),
      max_recursion_depth_(kDefaultMaxRecursionDepth) {
  // Initialize the stack with a single value to be parsed.
  stack_.push(VALUE);
}